

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_imm_ea(m68k_info *info,int opcode,uint8_t size,int imm)

{
  cs_m68k *pcVar1;
  undefined7 in_register_00000011;
  uint size_00;
  
  size_00 = (uint)CONCAT71(in_register_00000011,size);
  pcVar1 = build_init_op(info,opcode,2,size_00);
  pcVar1->operands[0].type = M68K_OP_IMM;
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  pcVar1->operands[0].field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)imm;
  get_ea_mode_op(info,pcVar1->operands + 1,info->ir,size_00);
  return;
}

Assistant:

static void build_imm_ea(m68k_info *info, int opcode, uint8_t size, int imm)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = imm;

	get_ea_mode_op(info, op1, info->ir, size);
}